

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nonogram.cpp
# Opt level: O2

void __thiscall Nonogram::step(Nonogram *this)

{
  Line *pLVar1;
  uint uVar2;
  pointer pLVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  Known *this_00;
  ulong uVar7;
  Known known;
  Known local_1c0;
  Known local_170;
  Known local_120;
  Known local_d0;
  Known local_80;
  
  known.second.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
  .super__Bit_iterator_base._M_offset = 0;
  known.second.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
  .super__Bit_iterator_base._12_4_ = 0;
  known.second.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  known.second.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  known.second.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._12_4_ = 0;
  known.second.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
  .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  known.first.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  known.second.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  known.first.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  known.first.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  known.first.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._12_4_ = 0;
  known.first.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  known.first.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  known.first.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._12_4_ = 0;
  uVar7 = (ulong)this->m_referred_number;
  lVar6 = uVar7 * 0x48;
  for (; uVar7 < (uint)(this->m_y + this->m_x); uVar7 = uVar7 + 1) {
    pLVar3 = (this->m_lines).super__Vector_base<Line,_std::allocator<Line>_>._M_impl.
             super__Vector_impl_data._M_start;
    pLVar1 = (Line *)((long)&(pLVar3->m_options).
                             super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                             ._M_impl + lVar6);
    uVar2 = *(uint *)((long)&pLVar3->m_index + lVar6);
    if ((&pLVar3->m_direction)[lVar6] == HORIZONTAL) {
      bVar4 = horizontal_changed(this,uVar2,-2,-1);
      if (bVar4) {
        get_horizontal(&local_d0,this,pLVar1->m_index);
        Line::calculate_known(&local_1c0,pLVar1,&local_d0);
        set_horizontal(this,&local_1c0,pLVar1->m_index);
        std::
        pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>::
        ~pair(&local_1c0);
        this_00 = &local_d0;
        goto LAB_00109cf0;
      }
    }
    else {
      bVar4 = vertical_changed(this,uVar2,-2,-1);
      if (bVar4) {
        get_vertical(&local_120,this,pLVar1->m_index);
        Line::calculate_known(&local_1c0,pLVar1,&local_120);
        set_vertical(this,&local_1c0,pLVar1->m_index);
        std::
        pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>::
        ~pair(&local_1c0);
        this_00 = &local_120;
LAB_00109cf0:
        std::
        pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>::
        ~pair(this_00);
      }
    }
    lVar6 = lVar6 + 0x48;
  }
  lVar6 = 0;
  uVar7 = 0;
  do {
    uVar5 = (ulong)this->m_referred_number;
    if (uVar5 <= uVar7) {
      lVar6 = 0;
      uVar7 = 0;
      while( true ) {
        if (uVar5 <= uVar7) break;
        pLVar3 = (this->m_lines).super__Vector_base<Line,_std::allocator<Line>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pLVar1 = (Line *)((long)&(pLVar3->m_options).
                                 super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                 ._M_impl + lVar6);
        uVar2 = *(uint *)((long)&pLVar3->m_index + lVar6);
        if ((&pLVar3->m_direction)[lVar6] == HORIZONTAL) {
          bVar4 = horizontal_changed(this,uVar2,-2,-1);
          if (bVar4) {
            get_horizontal(&local_80,this,pLVar1->m_index);
            Line::merge_options(&local_1c0,pLVar1,&local_80);
            std::
            pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>
            ::operator=(&known,&local_1c0);
            std::
            pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>
            ::~pair(&local_1c0);
            std::
            pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>
            ::~pair(&local_80);
            set_horizontal(this,&known,pLVar1->m_index);
          }
        }
        else {
          bVar4 = vertical_changed(this,uVar2,-2,-1);
          if (bVar4) {
            get_vertical(&local_170,this,pLVar1->m_index);
            Line::merge_options(&local_1c0,pLVar1,&local_170);
            std::
            pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>
            ::operator=(&known,&local_1c0);
            std::
            pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>
            ::~pair(&local_1c0);
            std::
            pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>
            ::~pair(&local_170);
            set_vertical(this,&known,pLVar1->m_index);
          }
        }
        uVar7 = uVar7 + 1;
        uVar5 = (ulong)this->m_referred_number;
        lVar6 = lVar6 + 0x48;
      }
      std::pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>
      ::~pair(&known);
      return;
    }
    pLVar3 = (this->m_lines).super__Vector_base<Line,_std::allocator<Line>_>._M_impl.
             super__Vector_impl_data._M_start;
    pLVar1 = (Line *)((long)&(pLVar3->m_options).
                             super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                             ._M_impl + lVar6);
    uVar2 = *(uint *)((long)&pLVar3->m_index + lVar6);
    if ((&pLVar3->m_direction)[lVar6] == HORIZONTAL) {
      bVar4 = horizontal_changed(this,uVar2,-2,-1);
      if (bVar4) {
        get_horizontal(&local_1c0,this,pLVar1->m_index);
        Line::filter(pLVar1,&local_1c0);
        goto LAB_00109d8c;
      }
    }
    else {
      bVar4 = vertical_changed(this,uVar2,-2,-1);
      if (bVar4) {
        get_vertical(&local_1c0,this,pLVar1->m_index);
        Line::filter(pLVar1,&local_1c0);
LAB_00109d8c:
        std::
        pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>::
        ~pair(&local_1c0);
      }
    }
    uVar7 = uVar7 + 1;
    lVar6 = lVar6 + 0x48;
  } while( true );
}

Assistant:

void Nonogram::step() {
    Known known;

    // Extract known values from lines that are not yet resolved, and set them in the board.
    for (unsigned int i = m_referred_number; i < m_x + m_y; i++) {
        auto &line = m_lines[i];
        if (line.m_direction == HORIZONTAL) {
            if (horizontal_changed(line.m_index)) {
                set_horizontal(line.calculate_known(get_horizontal(line.m_index)), line.m_index);
            }
        } else if (vertical_changed(line.m_index)) {
            set_vertical(line.calculate_known(get_vertical(line.m_index)), line.m_index);
        }
    }

    // Filter the resolved lines options by what is already known of the line.
    for (unsigned int i = 0; i < m_referred_number; i++) {
        auto &line = m_lines[i];
        if (line.m_direction == HORIZONTAL) {
            if (horizontal_changed(line.m_index)) {
                line.filter(get_horizontal(line.m_index));
            }
        } else if (vertical_changed(line.m_index)) {
            line.filter(get_vertical(line.m_index));
        }
    }

    // Extract known values from resolved lines, and set them in the board.
    for (unsigned int i = 0; i < m_referred_number; i++) {
        auto &line = m_lines[i];
        if (line.m_direction == HORIZONTAL) {
            if (horizontal_changed(line.m_index)) {
                known = line.merge_options(get_horizontal(line.m_index));
                set_horizontal(known, line.m_index);
            }
        } else if (vertical_changed(line.m_index)) {
            known = line.merge_options(get_vertical(line.m_index));
            set_vertical(known, line.m_index);
        }
    }
}